

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::FboUtil::FboBuilder::glAttach(FboBuilder *this,GLenum attPoint,Attachment *att)

{
  Functions *pFVar1;
  GLenum GVar2;
  long lVar3;
  GLuint GVar4;
  GLenum GVar5;
  
  pFVar1 = this->m_gl;
  if (att == (Attachment *)0x0) {
    GVar5 = this->m_target;
    GVar2 = 0x8d41;
    GVar4 = 0;
  }
  else {
    lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                           &FboUtil::config::RenderbufferAttachment::typeinfo,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                             &FboUtil::config::TextureFlatAttachment::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                               &FboUtil::config::TextureLayerAttachment::typeinfo,0);
        if (lVar3 != 0) {
          (*pFVar1->framebufferTextureLayer)
                    (*(GLenum *)(lVar3 + 8),attPoint,*(GLuint *)(lVar3 + 0xc),
                     *(GLint *)(lVar3 + 0x10),*(GLint *)(lVar3 + 0x14));
        }
      }
      else {
        (*pFVar1->framebufferTexture2D)
                  (*(GLenum *)(lVar3 + 8),attPoint,*(GLenum *)(lVar3 + 0x14),
                   *(GLuint *)(lVar3 + 0xc),*(GLint *)(lVar3 + 0x10));
      }
      goto LAB_01833b62;
    }
    GVar2 = *(GLenum *)(lVar3 + 0x10);
    GVar5 = *(GLenum *)(lVar3 + 8);
    GVar4 = *(GLuint *)(lVar3 + 0xc);
  }
  (*pFVar1->framebufferRenderbuffer)(GVar5,attPoint,GVar2,GVar4);
LAB_01833b62:
  GVar2 = (*this->m_gl->getError)();
  if ((GVar2 != 0) && (this->m_error == 0)) {
    this->m_error = GVar2;
  }
  FboUtil::config::Framebuffer::attach(&this->super_Framebuffer,attPoint,att);
  return;
}

Assistant:

void FboBuilder::glAttach (GLenum attPoint, const Attachment* att)
{
	if (att == NULL)
		m_gl.framebufferRenderbuffer(m_target, attPoint, GL_RENDERBUFFER, 0);
	else
		attachAttachment(*att, attPoint, m_gl);
	checkError();
	attach(attPoint, att);
}